

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::FieldMaskUtil::GetFieldDescriptors
          (FieldMaskUtil *this,Descriptor *descriptor,string_view path,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *field_descriptors)

{
  pointer ppFVar1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  pointer pbVar2;
  bool bVar3;
  FieldDescriptor *field;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  parts;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_60;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_48;
  
  this_00 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)path._M_str;
  local_60.text_._M_str = (char *)path._M_len;
  if ((this_00 !=
       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)0x0) &&
     (ppFVar1 = (this_00->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
     (this_00->
     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
     )._M_impl.super__Vector_impl_data._M_finish != ppFVar1)) {
    (this_00->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppFVar1;
  }
  local_60.delimiter_.c_ = '.';
  local_60.text_._M_len = (size_t)descriptor;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_nullptr>
            ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&local_48,&local_60);
  pbVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    bVar3 = pbVar2 == local_48._M_impl.super__Vector_impl_data._M_finish;
    if ((bVar3) || ((Descriptor *)this == (Descriptor *)0x0)) goto LAB_00cc593e;
    local_60.text_._M_len = (size_t)Descriptor::FindFieldByName((Descriptor *)this,*pbVar2);
    if ((Descriptor *)local_60.text_._M_len == (Descriptor *)0x0) break;
    if (this_00 !=
        (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         *)0x0) {
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back(this_00,(value_type *)&local_60);
    }
    bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)local_60.text_._M_len);
    if ((bVar3) ||
       (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                (ulong)(byte)*(undefined1 *)(local_60.text_._M_len + 2) * 4) != 10)) {
      this = (FieldMaskUtil *)0x0;
    }
    else {
      this = (FieldMaskUtil *)
             FieldDescriptor::message_type((FieldDescriptor *)local_60.text_._M_len);
    }
    pbVar2 = pbVar2 + 1;
  }
  bVar3 = false;
LAB_00cc593e:
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_48);
  return bVar3;
}

Assistant:

bool FieldMaskUtil::GetFieldDescriptors(
    const Descriptor* descriptor, absl::string_view path,
    std::vector<const FieldDescriptor*>* field_descriptors) {
  if (field_descriptors != nullptr) {
    field_descriptors->clear();
  }
  std::vector<absl::string_view> parts = absl::StrSplit(path, '.');
  for (absl::string_view field_name : parts) {
    if (descriptor == nullptr) {
      return false;
    }
    const FieldDescriptor* field = descriptor->FindFieldByName(field_name);
    if (field == nullptr) {
      return false;
    }
    if (field_descriptors != nullptr) {
      field_descriptors->push_back(field);
    }
    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      descriptor = field->message_type();
    } else {
      descriptor = nullptr;
    }
  }
  return true;
}